

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgt.c
# Opt level: O0

void tgt_encode(opj_bio_t *bio,opj_tgt_tree_t *tree,OPJ_UINT32 leafno,OPJ_INT32 threshold)

{
  int in_ECX;
  uint in_EDX;
  long in_RSI;
  OPJ_INT32 low;
  opj_tgt_node_t *node;
  opj_tgt_node_t **stkptr;
  opj_tgt_node_t *stk [31];
  int in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  int iVar1;
  long *local_128;
  undefined8 *local_120;
  undefined8 local_118 [32];
  int local_18;
  
  local_120 = local_118;
  local_18 = in_ECX;
  for (local_128 = (long *)(*(long *)(in_RSI + 0x10) + (ulong)in_EDX * 0x18); *local_128 != 0;
      local_128 = (long *)*local_128) {
    *local_120 = local_128;
    local_120 = local_120 + 1;
  }
  iVar1 = 0;
  do {
    if (*(int *)((long)local_128 + 0xc) < iVar1) {
      *(int *)((long)local_128 + 0xc) = iVar1;
    }
    else {
      iVar1 = *(int *)((long)local_128 + 0xc);
    }
    for (; iVar1 < local_18; iVar1 = iVar1 + 1) {
      if ((int)local_128[1] <= iVar1) {
        if ((int)local_128[2] == 0) {
          bio_write((opj_bio_t *)CONCAT44(iVar1,in_stack_fffffffffffffed0),in_stack_fffffffffffffecc
                    ,in_stack_fffffffffffffec8);
          *(undefined4 *)(local_128 + 2) = 1;
        }
        break;
      }
      bio_write((opj_bio_t *)CONCAT44(iVar1,in_stack_fffffffffffffed0),in_stack_fffffffffffffecc,
                in_stack_fffffffffffffec8);
    }
    *(int *)((long)local_128 + 0xc) = iVar1;
    if (local_120 == local_118) {
      return;
    }
    local_128 = (long *)local_120[-1];
    local_120 = local_120 + -1;
  } while( true );
}

Assistant:

void tgt_encode(opj_bio_t *bio, opj_tgt_tree_t *tree, OPJ_UINT32 leafno, OPJ_INT32 threshold) {
	opj_tgt_node_t *stk[31];
	opj_tgt_node_t **stkptr;
	opj_tgt_node_t *node;
	OPJ_INT32 low;

	stkptr = stk;
	node = &tree->nodes[leafno];
	while (node->parent) {
		*stkptr++ = node;
		node = node->parent;
	}
	
	low = 0;
	for (;;) {
		if (low > node->low) {
			node->low = low;
		} else {
			low = node->low;
		}
		
		while (low < threshold) {
			if (low >= node->value) {
				if (!node->known) {
					bio_write(bio, 1, 1);
					node->known = 1;
				}
				break;
			}
			bio_write(bio, 0, 1);
			++low;
		}
		
		node->low = low;
		if (stkptr == stk)
			break;
		node = *--stkptr;
	}
}